

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

uint128 * __thiscall trng::portable_impl::uint128::operator>>=(uint128 *this,int s)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = this->m_lo;
  uVar1 = this->m_hi;
  bVar3 = (byte)s;
  if (s < 0) {
    if (s < -0x3f) {
      uVar4 = uVar5 << (-bVar3 & 0x3f);
      uVar5 = 0;
    }
    else {
      bVar2 = bVar3 + 0x40 & 0x3f;
      uVar4 = uVar5 >> bVar2 | uVar1 << 0x40 - bVar2;
      uVar5 = uVar5 << (-bVar3 & 0x3f);
    }
  }
  else {
    uVar4 = uVar1;
    if (s != 0) {
      if (s < 0x40) {
        uVar4 = uVar1 >> (bVar3 & 0x3f);
        uVar5 = uVar5 >> (bVar3 & 0x3f) | uVar1 << 0x40 - (bVar3 & 0x3f);
      }
      else {
        uVar5 = uVar1 >> (bVar3 & 0x3f);
        uVar4 = 0;
      }
    }
  }
  this->m_lo = uVar5;
  this->m_hi = uVar4;
  return this;
}

Assistant:

uint128 &operator>>=(int s) {
        const uint128 result(*this >> s);
        *this = result;
        return *this;
      }